

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libj1939.c
# Opt level: O2

int libj1939_set_broadcast(int sock)

{
  FILE *__stream;
  int iVar1;
  int *piVar2;
  char *pcVar3;
  uint __errnum;
  int broadcast;
  
  iVar1 = setsockopt(sock,1,6,&broadcast,4);
  __errnum = 0;
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    __stream = _stderr;
    __errnum = -*piVar2;
    pcVar3 = strerror(__errnum);
    fprintf(__stream,"setsockopt(SO_BROADCAST): %d (%s)",(ulong)__errnum,pcVar3);
  }
  return __errnum;
}

Assistant:

int libj1939_set_broadcast(int sock)
{
	int broadcast = true;
	int ret;

	ret = setsockopt(sock, SOL_SOCKET, SO_BROADCAST, &broadcast,
			 sizeof(broadcast));
	if (ret < 0) {
		ret = -errno;
		pr_err("setsockopt(SO_BROADCAST): %d (%s)", ret, strerror(ret));
		return ret;
	}

	return 0;
}